

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O0

Matrix<float,_4,_2> *
tcu::operator+(Matrix<float,_4,_2> *__return_storage_ptr__,Matrix<float,_4,_2> *mtx,float scalar)

{
  float fVar1;
  float *pfVar2;
  undefined4 local_28;
  undefined4 local_24;
  int row;
  int col;
  float scalar_local;
  Matrix<float,_4,_2> *mtx_local;
  Matrix<float,_4,_2> *res;
  
  Matrix<float,_4,_2>::Matrix(__return_storage_ptr__);
  for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      pfVar2 = Matrix<float,_4,_2>::operator()(mtx,local_28,local_24);
      fVar1 = *pfVar2;
      pfVar2 = Matrix<float,_4,_2>::operator()(__return_storage_ptr__,local_28,local_24);
      *pfVar2 = fVar1 + scalar;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix<T, Rows, Cols> operator+ (const Matrix<T, Rows, Cols>& mtx, T scalar)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = mtx(row, col) + scalar;
	return res;
}